

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O1

void math::internal::matrix_gk_svd<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *vec_s,double *mat_v,
               double *epsilon)

{
  double *mat_v_00;
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  pointer pdVar10;
  double *pdVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  double *pdVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  bool bVar32;
  undefined1 local_140 [8];
  vector<double,_std::allocator<double>_> buffer;
  vector<double,_std::allocator<double>_> mat_b33;
  allocator_type local_49;
  int local_48;
  int local_44;
  double *local_40;
  undefined8 local_38;
  
  uVar31 = rows * rows;
  iVar26 = cols * rows;
  uVar27 = cols * cols;
  uVar18 = (ulong)uVar27;
  local_40 = mat_a;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_140,
             (long)(int)(uVar31 + (uVar27 + iVar26) * 2),
             (allocator_type *)
             &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pdVar1 = local_40;
  pdVar22 = (double *)((long)local_140 + (ulong)uVar31 * 8);
  lVar6 = (long)iVar26;
  mat_v_00 = pdVar22 + lVar6;
  local_40 = (double *)local_140;
  local_38 = (ulong)uVar31;
  matrix_bidiagonalize<double>(pdVar1,rows,cols,(double *)local_140,pdVar22,mat_v_00,epsilon);
  pdVar1 = mat_v_00 + uVar18;
  uVar25 = (ulong)(uint)cols;
  uVar7 = (ulong)(uint)rows;
  if (0 < rows) {
    pdVar8 = local_40 + uVar18 + lVar6 + local_38;
    uVar20 = 0;
    pdVar23 = local_40;
    do {
      if (0 < cols) {
        uVar24 = 0;
        do {
          pdVar8[uVar24] = pdVar23[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar25 != uVar24);
      }
      uVar20 = uVar20 + 1;
      pdVar8 = pdVar8 + uVar25;
      pdVar23 = pdVar23 + uVar7;
    } while (uVar20 != uVar7);
  }
  pdVar23 = pdVar1 + lVar6;
  local_44 = rows;
  if (cols != 0) {
    memmove(pdVar23,pdVar22,uVar18 * 8);
  }
  uVar20 = local_38;
  pdVar22 = local_40;
  uVar24 = 1;
  if (1 < uVar27) {
    uVar24 = (ulong)uVar27;
  }
  local_48 = cols + 1;
  iVar5 = 0;
  iVar13 = 0;
  if (0 < iVar26) {
    iVar13 = iVar26;
  }
  pdVar8 = local_40 + local_38 + uVar18 + lVar6 * 2 + 1;
  local_40 = (double *)(ulong)(uint)~cols;
  do {
    if (iVar5 == iVar13) break;
    if (cols != 0) {
      uVar9 = 0;
      do {
        dVar2 = pdVar22[uVar18 + uVar20 + lVar6 * 2 + uVar9];
        if ((0.0 - *epsilon <= dVar2) && (dVar2 <= *epsilon)) {
          pdVar22[uVar18 + uVar20 + lVar6 * 2 + uVar9] = 0.0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar24 != uVar9);
    }
    if (1 < cols) {
      iVar3 = 0;
      uVar9 = 1;
      pdVar11 = pdVar8;
      pdVar15 = pdVar23;
      iVar16 = local_48;
      do {
        if (ABS(*pdVar11) <= ABS(pdVar15[iVar3] + pdVar23[iVar16]) * *epsilon) {
          *pdVar11 = 0.0;
        }
        pdVar15 = pdVar15 + 1;
        iVar3 = iVar3 + cols;
        pdVar11 = pdVar11 + (long)cols + 1;
        iVar16 = iVar16 + local_48;
        bVar32 = uVar9 != cols - 1U;
        uVar9 = uVar9 + 1;
      } while (bVar32);
    }
    if (cols < 1) {
      uVar31 = 0;
    }
    else {
      lVar19 = 1;
      lVar29 = 8;
      uVar9 = 0;
      uVar30 = 0;
      local_38 = (ulong)(uVar27 - 1);
      do {
        uVar12 = uVar30 + 1;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,uVar12 * uVar12,&local_49);
        lVar17 = 0;
        pdVar10 = buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        uVar14 = local_38;
        do {
          lVar21 = 0;
          do {
            pdVar10[lVar21] = pdVar23[(int)uVar14 + (int)lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar19 != lVar21);
          lVar17 = lVar17 + 1;
          pdVar10 = (pointer)((long)pdVar10 + lVar29);
          uVar14 = uVar14 + uVar25;
        } while (lVar17 != lVar19);
        iVar16 = (int)uVar12;
        bVar32 = matrix_is_diagonal<double>
                           (buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,iVar16,iVar16,epsilon);
        uVar14 = uVar9;
        if ((bVar32) && (uVar14 = uVar12 & 0xffffffff, (long)uVar30 < (long)(int)(cols - 1U))) {
          bVar32 = matrix_is_submatrix_zero_enclosed<double>(pdVar23,cols,iVar16,epsilon);
          if (bVar32) {
            uVar9 = uVar12;
          }
          uVar14 = uVar9 & 0xffffffff;
        }
        uVar31 = (uint)uVar14;
        if (buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        }
        lVar19 = lVar19 + 1;
        lVar29 = lVar29 + 8;
        local_38 = local_38 + (long)local_40;
        uVar9 = uVar14;
        uVar30 = uVar12;
      } while (uVar12 != uVar25);
    }
    uVar28 = cols - uVar31;
    pdVar11 = (double *)operator_new__((ulong)(uVar28 * uVar28) << 3);
    if ((int)uVar28 < 1) {
      local_38 = (ulong)local_38._4_4_ << 0x20;
    }
    else {
      uVar9 = (ulong)(~uVar31 + cols * uVar28);
      uVar30 = 0;
      lVar19 = 1;
      lVar29 = 8;
      local_38 = (ulong)local_38._4_4_ << 0x20;
      do {
        uVar30 = uVar30 + 1;
        lVar17 = 0;
        uVar12 = uVar9;
        pdVar15 = pdVar11;
        do {
          lVar21 = 0;
          do {
            pdVar15[lVar21] = pdVar23[(int)uVar12 + (int)lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar19 != lVar21);
          lVar17 = lVar17 + 1;
          pdVar15 = (double *)((long)pdVar15 + lVar29);
          uVar12 = uVar12 + uVar25;
        } while (lVar17 != lVar19);
        iVar3 = (int)uVar30;
        bVar32 = matrix_is_superdiagonal_nonzero<double>(pdVar11,iVar3,iVar3,epsilon);
        iVar16 = (int)local_38;
        if (bVar32) {
          iVar16 = iVar3;
        }
        local_38 = CONCAT44(local_38._4_4_,iVar16);
        lVar19 = lVar19 + 1;
        lVar29 = lVar29 + 8;
        uVar9 = uVar9 + (long)local_40;
      } while (uVar30 != uVar28);
    }
    operator_delete__(pdVar11);
    if (cols == uVar31) break;
    iVar16 = uVar28 - (int)local_38;
    if (iVar16 < (int)(uVar28 - 1)) {
      iVar4 = local_48 * iVar16;
      iVar3 = (int)local_38;
      do {
        if ((0.0 - *epsilon <= pdVar23[iVar4]) && (pdVar23[iVar4] <= *epsilon)) {
          pdVar23[iVar4] = 0.0;
          matrix_svd_clear_super_entry<double>(local_44,cols,pdVar23,pdVar1,uVar28 - iVar3,epsilon);
          goto LAB_0010fa07;
        }
        iVar3 = iVar3 + -1;
        iVar4 = iVar4 + local_48;
      } while (iVar3 != 1);
    }
    matrix_gk_svd_step<double>(local_44,cols,pdVar23,pdVar1,mat_v_00,iVar16,uVar31,epsilon);
LAB_0010fa07:
    iVar5 = iVar5 + 1;
  } while (cols != uVar31);
  if (iVar26 != 0) {
    memmove(mat_u,pdVar1,lVar6 << 3);
  }
  if (cols != 0) {
    memmove(mat_v,mat_v_00,uVar18 << 3);
  }
  if (0 < cols) {
    iVar26 = 0;
    uVar18 = 0;
    do {
      vec_s[uVar18] = pdVar23[iVar26];
      uVar18 = uVar18 + 1;
      iVar26 = iVar26 + cols + 1;
    } while (uVar25 != uVar18);
  }
  if (0 < cols) {
    uVar18 = 0;
    do {
      if ((vec_s[uVar18] < *epsilon) &&
         (vec_s[uVar18] = -vec_s[uVar18], uVar20 = uVar7, pdVar22 = mat_u, 0 < local_44)) {
        do {
          *pdVar22 = -*pdVar22;
          uVar20 = uVar20 - 1;
          pdVar22 = pdVar22 + uVar25;
        } while (uVar20 != 0);
      }
      uVar18 = uVar18 + 1;
      mat_u = mat_u + 1;
    } while (uVar18 != uVar25);
  }
  if (local_140 != (undefined1  [8])0x0) {
    operator_delete((void *)local_140);
  }
  return;
}

Assistant:

void
matrix_gk_svd (T const* mat_a, int rows, int cols,
    T* mat_u, T* vec_s, T* mat_v, T const& epsilon)
{
    /* Allocate memory for temp matrices. */
    int const mat_q_full_size = rows * rows;
    int const mat_b_full_size = rows * cols;
    int const mat_p_size = cols * cols;
    int const mat_q_size = rows * cols;
    int const mat_b_size = cols * cols;

    std::vector<T> buffer(mat_q_full_size + mat_b_full_size
        + mat_p_size + mat_q_size + mat_b_size);
    T* mat_q_full = &buffer[0];
    T* mat_b_full = mat_q_full + mat_q_full_size;
    T* mat_p = mat_b_full + mat_b_full_size;
    T* mat_q = mat_p + mat_p_size;
    T* mat_b = mat_q + mat_q_size;

    matrix_bidiagonalize(mat_a, rows, cols,
        mat_q_full, mat_b_full, mat_p, epsilon);

    /* Extract smaller matrices. */
    for (int i = 0; i < rows; ++i)
    {
        for (int j = 0; j < cols; ++j)
        {
            mat_q[i * cols + j] = mat_q_full[i * rows + j];
        }
    }
    std::copy(mat_b_full, mat_b_full + cols * cols, mat_b);

    /* Avoid infinite loops and exit after maximum number of iterations. */
    int const max_iterations = rows * cols;
    int iteration = 0;
    while (iteration < max_iterations)
    {
        iteration += 1;

        /* Enforce exact zeros for numerical stability. */
        for (int i = 0; i < cols * cols; ++i)
        {
            T const& entry = mat_b[i];
            if (MATH_EPSILON_EQ(entry, T(0), epsilon))
                mat_b[i] = T(0);
        }

        /* GK 2a. */
        for (int i = 0; i < (cols - 1); ++i)
        {
            if (std::abs(mat_b[i * cols + (i + 1)]) <= epsilon *
                std::abs(mat_b[i * cols + i] + mat_b[(i + 1) * cols + (i + 1)]))
            {
                mat_b[i * cols + (i + 1)] = T(0);
            }
        }

        /* GK 2b. */
        /* Select q such that b33 is diagonal and blocked by zeros. */
        int q = 0;
        for (int k = 0; k < cols; ++k)
        {
            int const slice_len = k + 1;
            std::vector<T> mat_b33(slice_len * slice_len);
            for (int i = 0; i < slice_len; ++i)
            {
                for (int j = 0; j < slice_len; ++j)
                {
                    mat_b33[i * slice_len + j]
                        = mat_b[(cols - k - 1 + i) * cols + (cols - k - 1 + j)];
                }
            }

            if (matrix_is_diagonal(&mat_b33[0], slice_len, slice_len, epsilon))
            {
                if (k < cols - 1)
                {
                    if (matrix_is_submatrix_zero_enclosed(
                        mat_b, cols, k + 1, epsilon))
                    {
                        q = k + 1;
                    }
                }
                else
                {
                    q = k + 1;
                }
            }
        }

        /* Select z := n-p-q such that B22 has no zero superdiagonal entry. */
        int z = 0;
        T* mat_b22_tmp = new T[(cols - q) * (cols - q)];
        for (int k = 0; k < (cols - q); ++k)
        {
            int const slice_len = k + 1;
            for (int i = 0; i < slice_len; ++i)
            {
                for (int j = 0; j < slice_len; ++j)
                {
                    mat_b22_tmp[i * slice_len + j]
                        = mat_b[(cols - q - k - 1 + i)
                        * cols + (cols - q - k - 1 + j)];
                }
            }
            if (matrix_is_superdiagonal_nonzero(
                mat_b22_tmp, slice_len, slice_len, epsilon))
            {
                z = k + 1;
            }
        }
        delete[] mat_b22_tmp;

        int const p = cols - q - z;

        /* GK 2c. */
        if (q == cols)
            break;

        bool diagonal_non_zero = true;
        int nz = 0;
        for (nz = p; nz < (cols - q - 1); ++nz)
        {
            if (MATH_EPSILON_EQ(mat_b[nz * cols + nz], T(0), epsilon))
            {
                diagonal_non_zero = false;
                mat_b[nz * cols + nz] = T(0);
                break;
            }
        }

        if (diagonal_non_zero)
            matrix_gk_svd_step(rows, cols, mat_b, mat_q, mat_p, p, q, epsilon);
        else
            matrix_svd_clear_super_entry(rows, cols, mat_b, mat_q, nz, epsilon);
    }

    /* Create resulting matrices and vector from temporary entities. */
    std::copy(mat_q, mat_q + rows * cols, mat_u);
    std::copy(mat_p, mat_p + cols * cols, mat_v);
    for (int i = 0; i < cols; ++i)
        vec_s[i] = mat_b[i * cols + i];

    /* Correct signs. */
    for (int i = 0; i < cols; ++i)
    {
        if (vec_s[i] < epsilon)
        {
            vec_s[i] = -vec_s[i];
            for (int j = 0; j < rows; ++j)
            {
                int index = j * cols + i;
                mat_u[index] = -mat_u[index];
            }
        }
    }
}